

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall
arma::Mat<double>::Mat<false>
          (Mat<double> *this,uword in_n_rows,uword in_n_cols,arma_initmode_indicator<false> *param_4
          )

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  Mat<double> *in_stack_00000020;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ESI * in_EDX;
  in_RDI[3] = 0;
  *(undefined2 *)(in_RDI + 4) = 0;
  *(undefined2 *)((long)in_RDI + 0x12) = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  init_cold(in_stack_00000020);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const uword in_n_rows, const uword in_n_cols, const arma_initmode_indicator<do_zeros>&)
  : n_rows(in_n_rows)
  , n_cols(in_n_cols)
  , n_elem(in_n_rows*in_n_cols)
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  
  if(do_zeros)
    {
    arma_debug_print("Mat::constructor: zeroing memory");
    arrayops::fill_zeros(memptr(), n_elem);
    }
  else
    {
    arma_debug_print("Mat::constructor: not zeroing memory");
    }
  }